

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O1

void __thiscall ManchesterAnalyzer::ProcessBiPhaseData(ManchesterAnalyzer *this)

{
  U32 UVar1;
  ManchesterMode MVar2;
  pointer ppVar3;
  pointer puVar4;
  U64 location;
  long lVar5;
  ulong uVar6;
  long lVar7;
  U32 UVar8;
  
  if (this->mSynchronized != true) {
    return;
  }
  location = AnalyzerChannelData::GetSampleNumber();
  AnalyzerChannelData::AdvanceToNextEdge();
  lVar5 = AnalyzerChannelData::GetSampleNumber();
  uVar6 = lVar5 - location;
  UVar8 = this->mT;
  UVar1 = this->mTError;
  if (uVar6 < UVar1 + UVar8 * 2 && UVar8 * 2 - UVar1 < uVar6) {
    MVar2 = ((this->mSettings)._M_ptr)->mMode;
    if (MVar2 == BI_PHASE_SPACE) {
      UVar8 = 1;
    }
    else {
      if (MVar2 != BI_PHASE_MARK) {
        return;
      }
      UVar8 = 0;
    }
    SaveBit(this,location,UVar8);
    return;
  }
  MVar2 = ((this->mSettings)._M_ptr)->mMode;
  if (UVar1 + UVar8 <= uVar6 || uVar6 <= UVar8 - UVar1) {
    if (MVar2 == BI_PHASE_MARK) {
      UVar8 = 0;
    }
    else {
      if (MVar2 != BI_PHASE_SPACE) goto LAB_00106892;
      UVar8 = 1;
    }
    SaveBit(this,location,UVar8);
    goto LAB_00106892;
  }
  if (MVar2 == BI_PHASE_MARK) {
    UVar8 = 1;
LAB_00106839:
    SaveBit(this,location,UVar8);
  }
  else if (MVar2 == BI_PHASE_SPACE) {
    UVar8 = 0;
    goto LAB_00106839;
  }
  lVar5 = AnalyzerChannelData::GetSampleNumber();
  AnalyzerChannelData::AdvanceToNextEdge();
  lVar7 = AnalyzerChannelData::GetSampleNumber();
  if ((ulong)(this->mT - this->mTError) < (ulong)(lVar7 - lVar5) &&
      (ulong)(lVar7 - lVar5) < (ulong)(this->mTError + this->mT)) {
    return;
  }
LAB_00106892:
  this->mSynchronized = false;
  ppVar3 = (this->mBitsForNextByte).
           super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->mBitsForNextByte).
      super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar3) {
    (this->mBitsForNextByte).
    super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
  }
  puVar4 = (this->mUnsyncedLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mUnsyncedLocations).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (this->mUnsyncedLocations).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  this->mIgnoreBitCount = ((this->mSettings)._M_ptr)->mBitsToIgnore;
  return;
}

Assistant:

void ManchesterAnalyzer::ProcessBiPhaseData()
{
    if( mSynchronized == true )
    {
        U64 edge_location = mManchester->GetSampleNumber();

        mManchester->AdvanceToNextEdge();
        U64 next_edge_location = mManchester->GetSampleNumber();
        U64 edge_distance = next_edge_location - edge_location;
        if( ( edge_distance > ( ( 2 * mT ) - mTError ) ) && ( edge_distance < ( ( 2 * mT ) + mTError ) ) ) // long
        {
            if( mSettings->mMode == BI_PHASE_MARK ) // FM1
                SaveBit( edge_location, 0 );
            else if( mSettings->mMode == BI_PHASE_SPACE ) // FM0
                SaveBit( edge_location, 1 );
            return;
        }
        else if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short
        {
            if( mSettings->mMode == BI_PHASE_MARK ) // FM1
                SaveBit( edge_location, 1 );
            else if( mSettings->mMode == BI_PHASE_SPACE ) // FM0
                SaveBit( edge_location, 0 );

            edge_location = mManchester->GetSampleNumber();
            mManchester->AdvanceToNextEdge();
            next_edge_location = mManchester->GetSampleNumber();
            edge_distance = next_edge_location - edge_location;
            if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short.
            {
                return;
            }
            else
            {
                Invalidate();
                return;
                // not synced anymore.
            }
        }
        else
        {
            // record first, then invalidate. (long)
            if( mSettings->mMode == BI_PHASE_MARK ) // FM1
                SaveBit( edge_location, 0 );
            else if( mSettings->mMode == BI_PHASE_SPACE ) // FM0
                SaveBit( edge_location, 1 );
            Invalidate();
            return;
            // not synced anymore.
        }
    }
    return;
}